

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::score_basename_word_prefix_match
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  pointer pcVar3;
  pointer pCVar4;
  char32_t *pcVar5;
  char32_t *pcVar6;
  bool bVar7;
  pointer p_Var8;
  CharCount CVar9;
  ulong uVar10;
  CharCount CVar11;
  char32_t *pcVar12;
  pointer pCVar13;
  pointer pCVar14;
  
  pcVar5 = (this->item_basename_)._M_current;
  pcVar6 = (this->qit_basename_)._M_current;
  pCVar13 = (this->props_).
            super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
            ._M_impl.super__Vector_impl_data._M_start +
            ((long)pcVar5 -
             (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  pcVar1 = (this->query_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var8 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar9 = this->basename_longest_submatch_;
  CVar11 = this->basename_word_gaps_;
  uVar10 = 0;
  do {
    pcVar2 = p_Var8[1]._M_current;
    p_Var8 = p_Var8 + 1;
    bVar7 = false;
    pcVar12 = pcVar5;
    pCVar14 = pCVar13;
    do {
      if ((pcVar6 == pcVar2) || (*pcVar5 != *pcVar6)) {
        if (CVar9 <= uVar10) {
          CVar9 = uVar10;
        }
        this->basename_longest_submatch_ = CVar9;
        uVar10 = 0;
      }
      else {
        pcVar6 = pcVar6 + 1;
        uVar10 = uVar10 + 1;
        bVar7 = true;
        if (pcVar6 == pcVar1) {
          pcVar3 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (uVar10 < this->basename_longest_submatch_) {
            uVar10 = this->basename_longest_submatch_;
          }
          this->basename_longest_submatch_ = uVar10;
          this->unmatched_suffix_len_ = ((long)pcVar3 - (long)pcVar12 >> 2) - 1;
          return;
        }
      }
      pcVar5 = pcVar5 + 1;
      pCVar13 = pCVar14 + 1;
      pcVar12 = pcVar12 + 1;
      pCVar4 = pCVar14 + 1;
      pCVar14 = pCVar13;
    } while (pCVar4->word_start != true);
    if (!bVar7) {
      CVar11 = CVar11 + 1;
      this->basename_word_gaps_ = CVar11;
    }
  } while( true );
}

Assistant:

void score_basename_word_prefix_match() {
    auto item_it = item_basename_;
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto const query_last = query_.cend();
    // +1 because the first iteration of the loop skips the word start at the
    // beginning of the basename.
    auto qit_words_it = qit_basename_words_.cbegin() + 1;
    auto query_word_last = *qit_words_it;

    CharCount current_submatch = 0;
    bool any_word_matches = false;

    while (true) {
      if (query_it != query_word_last && *item_it == *query_it) {
        ++query_it;
        current_submatch++;
        any_word_matches = true;
        if (query_it == query_last) {
          break;
        }
      } else {
        basename_longest_submatch_ =
            std::max(basename_longest_submatch_, current_submatch);
        current_submatch = 0;
      }
      ++item_it;
      // At this point we know that the basename *is* a word prefix match, so
      // fully consuming the end of the query should be the only possible way
      // to leave this loop. Hence we skip the comparison to `item_.cend()`.
      // (The same applies to `qit_words_it` and `qit_basename_words_.cend()`
      // below.)
      ++props_it;
      if (props_it->word_start) {
        if (!any_word_matches) {
          basename_word_gaps_++;
        }
        any_word_matches = false;
        ++qit_words_it;
        query_word_last = *qit_words_it;
      }
    }
    basename_longest_submatch_ =
        std::max(basename_longest_submatch_, current_submatch);
    // -1 here because we broke out upon reaching the last match (`query_it ==
    // query_last`) before incrementing `item_it`.
    unmatched_suffix_len_ = item_.cend() - item_it - 1;
  }